

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::Quoted(string *__return_storage_ptr__,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  const_iterator local_160;
  value_type *pair;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_const_char_*>,_9UL> *__range1;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 local_a8 [8];
  array<std::pair<const_char_*,_const_char_*>,_9UL> replaces;
  string *text_local;
  string *res;
  
  local_b0 = "\\";
  local_b8 = "\\\\";
  replaces._M_elems[8].second = (char *)text;
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)local_a8,&local_b0,&local_b8);
  local_c0 = "\"";
  local_c8 = "\\\"";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[0].second,&local_c0,&local_c8);
  local_d0 = "\a";
  local_d8 = "\\a";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[1].second,&local_d0,&local_d8);
  local_e0 = "\b";
  local_e8 = "\\b";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[2].second,&local_e0,&local_e8);
  local_f0 = "\f";
  local_f8 = "\\f";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[3].second,&local_f0,&local_f8);
  local_100 = "\n";
  local_108 = "\\n";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[4].second,&local_100,&local_108)
  ;
  local_110 = "\r";
  local_118 = "\\r";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[5].second,&local_110,&local_118)
  ;
  local_120 = "\t";
  local_128 = "\\t";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[6].second,&local_120,&local_128)
  ;
  local_130 = "\v";
  local_138 = "\\v";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&replaces._M_elems[7].second,&local_130,&local_138)
  ;
  __range1._7_1_ = 0;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)replaces._M_elems[8].second);
  __begin1 = (const_iterator)local_a8;
  __end1 = std::array<std::pair<const_char_*,_const_char_*>,_9UL>::begin
                     ((array<std::pair<const_char_*,_const_char_*>,_9UL> *)__begin1);
  pair = std::array<std::pair<const_char_*,_const_char_*>,_9UL>::end
                   ((array<std::pair<const_char_*,_const_char_*>,_9UL> *)__begin1);
  for (; __end1 != pair; __end1 = __end1 + 1) {
    local_160 = __end1;
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,__end1->first,__end1->second);
  }
  std::operator+(&local_190,'\"',__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(std::string const& text)
{
  const std::array<std::pair<const char*, const char*>, 9> replaces = {
    { { "\\", "\\\\" },
      { "\"", "\\\"" },
      { "\a", "\\a" },
      { "\b", "\\b" },
      { "\f", "\\f" },
      { "\n", "\\n" },
      { "\r", "\\r" },
      { "\t", "\\t" },
      { "\v", "\\v" } }
  };

  std::string res = text;
  for (auto const& pair : replaces) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  res = '"' + res;
  res += '"';
  return res;
}